

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::map_slot_policy<std::__cxx11::string,int>::
     construct<std::allocator<std::pair<std::__cxx11::string_const,int>>,std::basic_string_view<char,std::char_traits<char>>,int>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                *alloc,slot_type *slot,basic_string_view<char,_std::char_traits<char>_> *args,
               int *args_1)

{
  int *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *alloc_local;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::emplace(slot);
  std::allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,int>>>::
  construct<std::pair<std::__cxx11::string,int>,std::basic_string_view<char,std::char_traits<char>>,int>
            (alloc,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)&slot->value,args,args_1);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }